

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_algorithm_identifier
              (uchar **p,uchar *start,char *oid,size_t oid_len,size_t par_len)

{
  int iVar1;
  long lVar2;
  size_t local_48;
  size_t len;
  int ret;
  size_t par_len_local;
  size_t oid_len_local;
  char *oid_local;
  uchar *start_local;
  uchar **p_local;
  
  local_48 = par_len;
  if (par_len == 0) {
    iVar1 = mbedtls_asn1_write_null(p,start);
    if (iVar1 < 0) {
      return iVar1;
    }
    local_48 = (size_t)iVar1;
  }
  p_local._4_4_ = mbedtls_asn1_write_oid(p,start,oid,oid_len);
  if (-1 < p_local._4_4_) {
    lVar2 = (long)p_local._4_4_;
    p_local._4_4_ = mbedtls_asn1_write_len(p,start,lVar2 + local_48);
    if (-1 < p_local._4_4_) {
      iVar1 = p_local._4_4_ + (int)(lVar2 + local_48);
      p_local._4_4_ = mbedtls_asn1_write_tag(p,start,'0');
      if (-1 < p_local._4_4_) {
        p_local._4_4_ = p_local._4_4_ + iVar1;
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_algorithm_identifier( unsigned char **p, unsigned char *start,
                                     const char *oid, size_t oid_len,
                                     size_t par_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    if( par_len == 0 )
        MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_null( p, start ) );
    else
        len += par_len;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_oid( p, start, oid, oid_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start,
                                       MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}